

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O0

int zueci_eci_to_utf8(int eci,uchar *src,int src_len,uint replacement_char,uint flags,uchar *dest,
                     int *p_dest_len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  uint in_ECX;
  byte *pbVar5;
  int in_EDX;
  byte *in_RSI;
  int in_EDI;
  uint in_R8D;
  uchar *in_R9;
  bool bVar6;
  uint state;
  int ret;
  int replacement_len;
  uchar replacement [5];
  int src_incr;
  zueci_u32 u;
  zueci_utf8_func_t utf8_func;
  uchar *d;
  uchar *se;
  uchar *s;
  uint local_64;
  int local_60;
  int local_5c;
  uchar local_55 [5];
  int local_50;
  zueci_u32 in_stack_ffffffffffffffb4;
  uchar *in_stack_ffffffffffffffb8;
  code *pcVar7;
  uchar *local_40;
  byte *local_30;
  int local_4;
  
  pbVar4 = in_RSI + in_EDX;
  local_5c = 0;
  local_60 = 0;
  iVar1 = zueci_is_valid_eci(in_EDI);
  if (iVar1 == 0) {
    local_4 = 7;
  }
  else if (((in_RSI == (byte *)0x0) || (in_R9 == (uchar *)0x0)) || (_ret == (int *)0x0)) {
    local_4 = 8;
  }
  else {
    iVar1 = (int)in_R9;
    local_40 = in_R9;
    local_30 = in_RSI;
    if ((in_EDI == 899) ||
       (((in_R8D & 1) != 0 &&
        (((in_EDI == 1 || (in_EDI == 3)) || ((in_EDI == 0x1b || (in_EDI == 0xaa)))))))) {
      while (local_30 < pbVar4) {
        iVar2 = zueci_encode_utf8((uint)*local_30,local_40);
        local_40 = local_40 + iVar2;
        local_30 = local_30 + 1;
      }
      *_ret = (int)local_40 - iVar1;
      local_4 = 0;
    }
    else {
      if (in_ECX != 0) {
        if (((0xd7ff < in_ECX) && ((in_ECX < 0xe000 || (0x10ffff < in_ECX)))) || (0xffff < in_ECX))
        {
          return 8;
        }
        local_5c = zueci_encode_utf8(in_ECX,local_55);
      }
      if ((in_EDI == 1) || (in_EDI == 3)) {
        for (; local_30 < pbVar4; local_30 = local_30 + 1) {
          if ((*local_30 < 0x80) || (0x9f < *local_30)) {
            iVar2 = zueci_encode_utf8((uint)*local_30,local_40);
          }
          else {
            if (in_ECX == 0) {
              return 6;
            }
            memcpy(local_40,local_55,(long)local_5c);
            local_60 = 1;
            iVar2 = local_5c;
          }
          local_40 = local_40 + iVar2;
        }
        *_ret = (int)local_40 - iVar1;
        local_4 = local_60;
      }
      else if (in_EDI == 0x1a) {
        if (in_ECX == 0) {
          iVar1 = zueci_is_valid_utf8(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
          if (iVar1 == 0) {
            local_4 = 9;
          }
          else {
            memcpy(in_R9,in_RSI,(long)in_EDX);
            *_ret = in_EDX;
            local_4 = 0;
          }
        }
        else {
          local_64 = 0;
          while (pbVar5 = local_30, local_30 < pbVar4) {
            do {
              local_30 = pbVar5;
              pbVar5 = local_30 + 1;
              zueci_decode_utf8(&local_64,(zueci_u32 *)&stack0xffffffffffffffb4,*local_30);
              bVar6 = false;
              if ((pbVar5 < pbVar4) && (bVar6 = false, local_64 != 0)) {
                bVar6 = local_64 != 0xc;
              }
            } while (bVar6);
            if (local_64 == 0) {
              iVar2 = zueci_encode_utf8(in_stack_ffffffffffffffb4,local_40);
              local_30 = pbVar5;
            }
            else {
              if (0x7f < *local_30) {
                while( true ) {
                  local_30 = pbVar5;
                  bVar6 = false;
                  if (local_30 < pbVar4) {
                    bVar6 = (*local_30 & 0xc0) == 0x80;
                  }
                  if (!bVar6) break;
                  pbVar5 = local_30 + 1;
                }
              }
              memcpy(local_40,local_55,(long)local_5c);
              local_60 = 1;
              local_64 = 0;
              iVar2 = local_5c;
            }
            local_40 = local_40 + iVar2;
          }
          *_ret = (int)local_40 - iVar1;
          local_4 = local_60;
        }
      }
      else {
        if (in_EDI == 0xaa) {
          pcVar7 = zueci_ascii_inv_u;
        }
        else {
          pcVar7 = zueci_utf8_funcs[in_EDI];
        }
        for (; local_30 < pbVar4; local_30 = local_30 + iVar2) {
          iVar2 = (*pcVar7)(local_30,(int)pbVar4 - (int)local_30,in_R8D,
                            (zueci_u32 *)&stack0xffffffffffffffb4);
          local_50 = iVar2;
          if (iVar2 == 0) {
            if (in_ECX == 0) {
              return 6;
            }
            memcpy(local_40,local_55,(long)local_5c);
            iVar2 = zueci_replacement_incr(in_EDI,local_30,(int)pbVar4 - (int)local_30);
            local_60 = 1;
            iVar3 = local_5c;
          }
          else {
            iVar3 = zueci_encode_utf8(in_stack_ffffffffffffffb4,local_40);
          }
          local_40 = local_40 + iVar3;
        }
        *_ret = (int)local_40 - iVar1;
        local_4 = local_60;
      }
    }
  }
  return local_4;
}

Assistant:

ZUECI_EXTERN int zueci_eci_to_utf8(const int eci, const unsigned char src[], const int src_len,
                    const unsigned int replacement_char, const unsigned int flags, unsigned char dest[],
                    int *p_dest_len) {
    const unsigned char *s = src;
    const unsigned char *const se = src + src_len;
    unsigned char *d = dest;
    zueci_utf8_func_t utf8_func;
    zueci_u32 u;
    int src_incr;
    unsigned char replacement[5];
    int replacement_len = 0; /* g++ complains with "-Wmaybe-uninitialized" if this isn't set */
    int ret = 0;

    if (!zueci_is_valid_eci(eci)) {
        return ZUECI_ERROR_INVALID_ECI;
    }
    if (!src || !dest || !p_dest_len) {
        return ZUECI_ERROR_INVALID_ARGS;
    }

    /* Special case Binary, and if straight-thru flag set then ISO/IEC 8859-1, ASCII and ISO/IEC 646 Invariant also */
    if (eci == 899 || ((flags & ZUECI_FLAG_SB_STRAIGHT_THRU) && (eci == 1 || eci == 3 || eci == 27 || eci == 170))) {
        while (s < se) {
            d += zueci_encode_utf8(*s++, d);
        }
        *p_dest_len = (int) (d - dest);
        return 0;
    }

    if (replacement_char) {
        if (!ZUECI_IS_VALID_UNICODE(replacement_char) || replacement_char > 0xFFFF) { /* Allow BMP only */
            return ZUECI_ERROR_INVALID_ARGS;
        }
        replacement_len = zueci_encode_utf8(replacement_char, replacement);
    }

    /* Special case ISO/IEC 8859-1 */
    if (eci == 1 || eci == 3) {
        for (; s < se; s++) {
            if (*s >= 0x80 && *s < 0xA0) {
                if (!replacement_char) {
                    return ZUECI_ERROR_INVALID_DATA;
                }
                memcpy(d, replacement, replacement_len);
                d += replacement_len;
                ret = ZUECI_WARN_INVALID_DATA;
            } else {
                d += zueci_encode_utf8(*s, d);
            }
        }
        *p_dest_len = (int) (d - dest);
        return ret;
    }

    /* Special case UTF-8 */
    if (eci == 26) {
        if (replacement_char) {
            unsigned int state = 0;
            while (s < se) {
                do {
                    zueci_decode_utf8(&state, &u, *s++);
                } while (s < se && state != 0 && state != 12);
                if (state != 0) {
                    if (*(s - 1) < 0x80) { /* If previous ASCII, backtrack */
                        s--;
                    } else {
                        while (s < se && (*s & 0xC0) == 0x80) { /* Skip any continuation bytes */
                            s++;
                        }
                    }
                    memcpy(d, replacement, replacement_len);
                    d += replacement_len;
                    ret = ZUECI_WARN_INVALID_DATA;
                    state = 0;
                } else {
                    d += zueci_encode_utf8(u, d);
                }
            }
            *p_dest_len = (int) (d - dest);
            return ret;
        }
        if (!zueci_is_valid_utf8(src, src_len)) {
            return ZUECI_ERROR_INVALID_UTF8;
        }
        memcpy(dest, src, src_len);
        *p_dest_len = src_len;
        return 0;
    }

    if (eci == 170) {
        utf8_func = zueci_ascii_inv_u;
    } else {
        utf8_func = zueci_utf8_funcs[eci];
    }

    while (s < se) {
        if (!(src_incr = (*utf8_func)(s, (int) (se - s), flags, &u))) {
            if (!replacement_char) {
                return ZUECI_ERROR_INVALID_DATA;
            }
            memcpy(d, replacement, replacement_len);
            s += zueci_replacement_incr(eci, s, (int) (se - s));
            d += replacement_len;
            ret = ZUECI_WARN_INVALID_DATA;
        } else {
            s += src_incr;
            d += zueci_encode_utf8(u, d);
        }
    }
    *p_dest_len = (int) (d - dest);
    return ret;
}